

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O1

void __thiscall QInputDialogPrivate::ensureLineEdit(QInputDialogPrivate *this)

{
  QWidget *parent;
  QLineEdit *pQVar1;
  void **ppvVar2;
  QWidget *widget;
  QWidgetPrivate *pQVar3;
  undefined4 *puVar4;
  long in_FS_OFFSET;
  QObject local_60 [8];
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->lineEdit == (QLineEdit *)0x0) {
    parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    widget = (QWidget *)operator_new(0x28);
    QLineEdit::QLineEdit((QLineEdit *)widget,parent);
    this->lineEdit = (QLineEdit *)widget;
    pQVar3 = qt_widget_private(widget);
    pQVar3->field_0x253 = pQVar3->field_0x253 | 4;
    QWidget::hide(&this->lineEdit->super_QWidget);
    pQVar1 = this->lineEdit;
    local_48 = QLineEdit::textChanged;
    local_40 = 0;
    local_58 = textChanged;
    local_50 = (ImplFn)0x0;
    ppvVar2 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    puVar4 = (undefined4 *)operator_new(0x20);
    *puVar4 = 1;
    *(code **)(puVar4 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QInputDialogPrivate::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
         ::impl;
    *(code **)(puVar4 + 4) = textChanged;
    *(undefined8 *)(puVar4 + 6) = 0;
    QObject::connectImpl
              (local_60,(void **)pQVar1,(QObject *)&local_48,ppvVar2,(QSlotObjectBase *)&local_58,
               (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensureLineEdit()
{
    Q_Q(QInputDialog);
    if (!lineEdit) {
        lineEdit = new QLineEdit(q);
#ifndef QT_NO_IM
        qt_widget_private(lineEdit)->inheritsInputMethodHints = 1;
#endif
        lineEdit->hide();
        QObjectPrivate::connect(lineEdit, &QLineEdit::textChanged,
                                this, &QInputDialogPrivate::textChanged);
    }
}